

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void disableCursor(_GLFWwindow *window)

{
  _GLFWwindow *in_RDI;
  double *unaff_retaddr;
  double *in_stack_00000008;
  _GLFWwindow *in_stack_00000010;
  uchar mask [3];
  XIEventMask em;
  _GLFWwindow *in_stack_ffffffffffffffd0;
  uchar local_1b [2];
  byte local_19;
  XIEventMask local_18;
  _GLFWwindow *local_8;
  
  local_8 = in_RDI;
  if (_glfw.x11.xi.available != 0) {
    memset(local_1b,0,3);
    local_18.deviceid = 1;
    local_18.mask_len = 3;
    local_18.mask = local_1b;
    local_19 = local_19 | 2;
    (*_glfw.x11.xi.SelectEvents)(_glfw.x11.display,_glfw.x11.root,&local_18,1);
  }
  _glfw.x11.disabledCursorWindow = local_8;
  _glfwPlatformGetCursorPos(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  updateCursorImage((_GLFWwindow *)0x1f621c);
  centerCursor(in_stack_ffffffffffffffd0);
  XGrabPointer(_glfw.x11.display,(local_8->x11).handle,1,0x4c,1,1,(local_8->x11).handle,
               _glfw.x11.hiddenCursorHandle,0);
  return;
}

Assistant:

static void disableCursor(_GLFWwindow* window)
{
    if (_glfw.x11.xi.available)
    {
        XIEventMask em;
        unsigned char mask[XIMaskLen(XI_RawMotion)] = { 0 };

        em.deviceid = XIAllMasterDevices;
        em.mask_len = sizeof(mask);
        em.mask = mask;
        XISetMask(mask, XI_RawMotion);

        XISelectEvents(_glfw.x11.display, _glfw.x11.root, &em, 1);
    }

    _glfw.x11.disabledCursorWindow = window;
    _glfwPlatformGetCursorPos(window,
                              &_glfw.x11.restoreCursorPosX,
                              &_glfw.x11.restoreCursorPosY);
    updateCursorImage(window);
    centerCursor(window);
    XGrabPointer(_glfw.x11.display, window->x11.handle, True,
                 ButtonPressMask | ButtonReleaseMask | PointerMotionMask,
                 GrabModeAsync, GrabModeAsync,
                 window->x11.handle,
                 _glfw.x11.hiddenCursorHandle,
                 CurrentTime);
}